

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void diffwtd_mask_d16(uint8_t *mask,int which_inverse,int mask_base,CONV_BUF_TYPE *src0,
                     int src0_stride,CONV_BUF_TYPE *src1,int src1_stride,int h,int w,
                     ConvolveParams *conv_params,int bd)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint8_t uVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  undefined4 in_register_00000084;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_stack_0000001c;
  
  lVar8 = CONCAT44(in_register_00000084,src0_stride);
  lVar10 = CONCAT44(in_register_00000014,mask_base);
  bVar5 = ((char)conv_params -
          ((char)*(undefined4 *)(CONCAT44(in_stack_0000001c,w) + 0x14) +
          (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,w) + 0x18))) + 6;
  uVar11 = 0;
  uVar12 = 0;
  if (0 < h) {
    uVar12 = (ulong)(uint)h;
  }
  uVar7 = (ulong)(uint)src1_stride;
  if (src1_stride < 1) {
    uVar7 = uVar11;
  }
  for (; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      uVar3 = (uint)*(ushort *)(lVar10 + uVar9 * 2) - (uint)*(ushort *)(lVar8 + uVar9 * 2);
      uVar2 = -uVar3;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      uVar1 = (long)((int)((uVar2 & 0xffff) + ((1 << (bVar5 & 0x1f)) >> 1)) >> (bVar5 & 0x1f)) /
              0x10;
      uVar4 = uVar1 & 0xffffffff;
      if (0x19 < (int)uVar1) {
        uVar4 = 0x1a;
      }
      if ((int)uVar4 < -0x25) {
        uVar4 = 0xffffffda;
      }
      uVar6 = '\x1a' - (char)uVar4;
      if (which_inverse == 0) {
        uVar6 = (char)uVar4 + '&';
      }
      mask[uVar9] = uVar6;
    }
    mask = mask + h;
    lVar8 = lVar8 + (long)(int)src1 * 2;
    lVar10 = lVar10 + (long)(int)src0 * 2;
  }
  return;
}

Assistant:

static inline void diffwtd_mask_d16(uint8_t *mask, int which_inverse,
                                    int mask_base, const CONV_BUF_TYPE *src0,
                                    int src0_stride, const CONV_BUF_TYPE *src1,
                                    int src1_stride, int h, int w,
                                    ConvolveParams *conv_params, int bd) {
  int round =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  int i, j, m, diff;
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      diff = abs(src0[i * src0_stride + j] - src1[i * src1_stride + j]);
      diff = ROUND_POWER_OF_TWO(diff, round);
      m = clamp(mask_base + (diff / DIFF_FACTOR), 0, AOM_BLEND_A64_MAX_ALPHA);
      mask[i * w + j] = which_inverse ? AOM_BLEND_A64_MAX_ALPHA - m : m;
    }
  }
}